

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.h
# Opt level: O1

void __thiscall
cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
          (cmGeneratorExpressionInterpreter *this,cmLocalGenerator *localGenerator,string *config,
          cmGeneratorTarget *headTarget,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  cmListFileBacktrace local_38;
  
  local_38.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_38.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&this->GeneratorExpression,&local_38);
  if (local_38.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->CompiledGeneratorExpression)._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (cmCompiledGeneratorExpression *)0x0;
  this->LocalGenerator = localGenerator;
  paVar1 = &(this->Config).field_2;
  (this->Config)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (config->_M_dataplus)._M_p;
  paVar2 = &config->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&config->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Config).field_2 + 8) = uVar4;
  }
  else {
    (this->Config)._M_dataplus._M_p = pcVar3;
    (this->Config).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Config)._M_string_length = config->_M_string_length;
  (config->_M_dataplus)._M_p = (pointer)paVar2;
  config->_M_string_length = 0;
  (config->field_2)._M_local_buf[0] = '\0';
  this->HeadTarget = headTarget;
  paVar1 = &(this->Language).field_2;
  (this->Language)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (lang->_M_dataplus)._M_p;
  paVar2 = &lang->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&lang->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Language).field_2 + 8) = uVar4;
  }
  else {
    (this->Language)._M_dataplus._M_p = pcVar3;
    (this->Language).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Language)._M_string_length = lang->_M_string_length;
  (lang->_M_dataplus)._M_p = (pointer)paVar2;
  lang->_M_string_length = 0;
  (lang->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmGeneratorExpressionInterpreter(cmLocalGenerator* localGenerator,
                                   std::string config,
                                   cmGeneratorTarget const* headTarget,
                                   std::string lang = std::string())
    : LocalGenerator(localGenerator)
    , Config(std::move(config))
    , HeadTarget(headTarget)
    , Language(std::move(lang))
  {
  }